

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

bool argparse::Argument::is_decimal_literal(string_view s)

{
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view s_04;
  string_view s_05;
  string_view s_06;
  string_view s_07;
  string_view s_08;
  string_view s_09;
  string_view s_10;
  bool bVar1;
  int iVar2;
  char *in_RSI;
  size_t in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  anon_class_1_1_ee830756 consume_digits;
  anon_class_1_0_00000001 is_digit;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  anon_class_1_1_ee830756 *local_108;
  size_t in_stack_ffffffffffffff08;
  size_t sVar4;
  char *in_stack_ffffffffffffff10;
  char *pcVar5;
  size_t local_b8;
  char *local_b0;
  size_t local_68;
  char *local_60;
  size_t local_48;
  char *local_40;
  _lambda_auto_1__1_ local_19;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  bool local_1;
  
  local_19 = (_lambda_auto_1__1_)0x0;
  s_00._M_str._0_4_ = in_stack_fffffffffffffed8;
  s_00._M_len = 0x18fc06;
  s_00._M_str._4_4_ = in_stack_fffffffffffffedc;
  local_18._M_len = in_RDI;
  local_18._M_str = in_RSI;
  iVar2 = lookahead(s_00);
  if (iVar2 == 0x2e) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_18,1);
LAB_0018fe5e:
    s_03._M_str._0_4_ = in_stack_fffffffffffffed8;
    s_03._M_len = 0x18fe93;
    s_03._M_str._4_4_ = in_stack_fffffffffffffedc;
    iVar2 = lookahead(s_03);
    bVar1 = is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::
            {lambda(auto:1)#1}::operator()(&local_19,iVar2);
    if (!bVar1) {
      return false;
    }
    s_09._M_str = in_stack_ffffffffffffff10;
    s_09._M_len = in_stack_ffffffffffffff08;
    bVar3 = is_decimal_literal::anon_class_1_1_ee830756::operator()(local_108,s_09);
    local_b8 = bVar3._M_len;
    local_18._M_len = local_b8;
    local_b0 = bVar3._M_str;
    local_18._M_str = local_b0;
  }
  else {
    if (iVar2 == 0x30) {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_18,1);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
      if (bVar1) {
        return true;
      }
      s_08._M_str = in_stack_ffffffffffffff10;
      s_08._M_len = in_stack_ffffffffffffff08;
      bVar3 = is_decimal_literal::anon_class_1_1_ee830756::operator()(local_108,s_08);
      local_68 = bVar3._M_len;
      local_18._M_len = local_68;
      local_60 = bVar3._M_str;
      local_18._M_str = local_60;
    }
    else {
      if (8 < iVar2 - 0x31U) {
        return false;
      }
      s_07._M_str = in_stack_ffffffffffffff10;
      s_07._M_len = in_stack_ffffffffffffff08;
      bVar3 = is_decimal_literal::anon_class_1_1_ee830756::operator()(local_108,s_07);
      local_48 = bVar3._M_len;
      local_18._M_len = local_48;
      local_40 = bVar3._M_str;
      local_18._M_str = local_40;
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
      if (bVar1) {
        return true;
      }
    }
    s_01._M_str._0_4_ = in_stack_fffffffffffffed8;
    s_01._M_len = 0x18fdb4;
    s_01._M_str._4_4_ = in_stack_fffffffffffffedc;
    iVar2 = lookahead(s_01);
    if (iVar2 != 0x2e) {
      if ((iVar2 != 0x45) && (iVar2 != 0x65)) {
        return false;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_18,1);
      goto LAB_0018ff7b;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_18,1);
    s_02._M_str._0_4_ = in_stack_fffffffffffffed8;
    s_02._M_len = 0x18fe1e;
    s_02._M_str._4_4_ = in_stack_fffffffffffffedc;
    iVar2 = lookahead(s_02);
    bVar1 = is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::
            {lambda(auto:1)#1}::operator()(&local_19,iVar2);
    if (bVar1) goto LAB_0018fe5e;
  }
  s_04._M_str._0_4_ = in_stack_fffffffffffffed8;
  s_04._M_len = 0x18ff2a;
  s_04._M_str._4_4_ = in_stack_fffffffffffffedc;
  in_stack_fffffffffffffedc = lookahead(s_04);
  if (in_stack_fffffffffffffedc == -1) {
    return true;
  }
  if ((in_stack_fffffffffffffedc != 0x45) && (in_stack_fffffffffffffedc != 0x65)) {
    return false;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_18,1);
LAB_0018ff7b:
  s_05._M_str._0_4_ = in_stack_fffffffffffffed8;
  s_05._M_len = 0x18ff99;
  s_05._M_str._4_4_ = in_stack_fffffffffffffedc;
  iVar2 = lookahead(s_05);
  if ((iVar2 == 0x2b) || (iVar2 == 0x2d)) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_18,1);
  }
  s_06._M_str._0_4_ = iVar2;
  s_06._M_len = 0x18ffea;
  s_06._M_str._4_4_ = in_stack_fffffffffffffedc;
  sVar4 = local_18._M_len;
  pcVar5 = local_18._M_str;
  iVar2 = lookahead(s_06);
  bVar1 = is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::
          {lambda(auto:1)#1}::operator()(&local_19,iVar2);
  if (bVar1) {
    s_10._M_str = pcVar5;
    s_10._M_len = sVar4;
    bVar3 = is_decimal_literal::anon_class_1_1_ee830756::operator()(local_108,s_10);
    local_108 = (anon_class_1_1_ee830756 *)bVar3._M_len;
    local_18._M_len = (size_t)local_108;
    local_18._M_str = bVar3._M_str;
    local_1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool is_decimal_literal(std::string_view s) {
            auto is_digit = [](auto c) constexpr {
                switch (c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9':
                        return true;
                    default:
                        return false;
                }
            };

            // precondition: we have consumed or will consume at least one digit
            auto consume_digits = [=](std::string_view s) {
                auto it = std::find_if_not(std::begin(s), std::end(s), is_digit);
                return s.substr(it - std::begin(s));
            };

            switch (lookahead(s)) {
                case '0': {
                    s.remove_prefix(1);
                    if (s.empty())
                        return true;
                    else
                        goto integer_part;
                }
                case '1':
                case '2':
                case '3':
                case '4':
                case '5':
                case '6':
                case '7':
                case '8':
                case '9': {
                    s = consume_digits(s);
                    if (s.empty())
                        return true;
                    else
                        goto integer_part_consumed;
                }
                case '.': {
                    s.remove_prefix(1);
                    goto post_decimal_point;
                }
                default:
                    return false;
            }

            integer_part:
            s = consume_digits(s);
            integer_part_consumed:
            switch (lookahead(s)) {
                case '.': {
                    s.remove_prefix(1);
                    if (is_digit(lookahead(s)))
                        goto post_decimal_point;
                    else
                        goto exponent_part_opt;
                }
                case 'e':
                case 'E': {
                    s.remove_prefix(1);
                    goto post_e;
                }
                default:
                    return false;
            }

            post_decimal_point:
            if (is_digit(lookahead(s))) {
                s = consume_digits(s);
                goto exponent_part_opt;
            } else {
                return false;
            }

            exponent_part_opt:
            switch (lookahead(s)) {
                case eof:
                    return true;
                case 'e':
                case 'E': {
                    s.remove_prefix(1);
                    goto post_e;
                }
                default:
                    return false;
            }

            post_e:
            switch (lookahead(s)) {
                case '-':
                case '+':
                    s.remove_prefix(1);
            }
            if (is_digit(lookahead(s))) {
                s = consume_digits(s);
                return s.empty();
            } else {
                return false;
            }
        }